

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial(TPZGaussRule *this,longdouble x,int alpha,int beta,uint n)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  longdouble *plVar5;
  longdouble *extraout_RAX;
  uint in_ECX;
  int iVar6;
  int iVar7;
  int in_EDX;
  int iVar8;
  int in_ESI;
  int iVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_stack_00000008;
  uint i;
  int a4;
  int a3;
  int a2;
  int a1;
  int v;
  TPZVec<long_double> p;
  int64_t in_stack_fffffffffffffeb8;
  TPZVec<long_double> *in_stack_fffffffffffffec0;
  uint local_94;
  TPZVec<long_double> local_68;
  uint local_44;
  int local_40;
  int local_3c;
  longdouble local_38;
  longdouble local_18;
  
  local_38 = in_stack_00000008;
  local_44 = in_ECX;
  local_40 = in_EDX;
  local_3c = in_ESI;
  TPZVec<long_double>::TPZVec(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  plVar5 = TPZVec<long_double>::operator[](&local_68,0);
  *plVar5 = (longdouble)1;
  if (local_44 == 0) {
    plVar5 = TPZVec<long_double>::operator[](&local_68,0);
    local_18 = *plVar5;
  }
  else {
    iVar2 = local_3c - local_40;
    lVar10 = ((longdouble)2.0 + (longdouble)(local_3c + local_40)) * local_38;
    plVar5 = TPZVec<long_double>::operator[](&local_68,1);
    *plVar5 = (longdouble)0.5 * (lVar10 + (longdouble)iVar2);
    if (local_44 == 1) {
      plVar5 = TPZVec<long_double>::operator[](&local_68,1);
      local_18 = *plVar5;
    }
    else {
      for (local_94 = 1; local_94 <= local_44 - 1; local_94 = local_94 + 1) {
        iVar3 = local_3c + local_94 * 2 + local_40;
        iVar9 = local_94 + local_3c;
        iVar2 = local_40 + 1;
        iVar6 = local_3c * local_3c;
        iVar8 = local_40 * local_40;
        iVar4 = local_94 + local_3c;
        iVar7 = local_94 + local_40;
        lVar11 = local_38 * (longdouble)(iVar3 * (iVar3 + 1) * (iVar3 + 2));
        plVar5 = TPZVec<long_double>::operator[](&local_68,(ulong)local_94);
        lVar10 = *plVar5;
        plVar5 = TPZVec<long_double>::operator[](&local_68,(ulong)(local_94 - 1));
        lVar1 = *plVar5;
        plVar5 = TPZVec<long_double>::operator[](&local_68,(ulong)(local_94 + 1));
        *plVar5 = ((lVar11 + (longdouble)((iVar3 + 1) * (iVar6 - iVar8))) * lVar10 -
                  lVar1 * (longdouble)(iVar4 * iVar7 * (iVar3 + 2) * 2)) /
                  (longdouble)(int)((local_94 + 1) * (iVar2 + iVar9) * iVar3 * 2);
      }
      in_stack_fffffffffffffec0 =
           (TPZVec<long_double> *)TPZVec<long_double>::operator[](&local_68,(ulong)local_44);
      local_18 = *(longdouble *)in_stack_fffffffffffffec0;
    }
  }
  TPZVec<long_double>::~TPZVec(in_stack_fffffffffffffec0);
  return extraout_RAX;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x,int alpha,int beta,unsigned int n) {
	// the Jacobi polynomial is evaluated
	// using a recursion formula.
	TPZVec<long double> p(n+1);
	int v, a1, a2, a3, a4;
	
	// initial values P_0(x), P_1(x):
	p[0] = 1.0L;
	if(n==0) return p[0];
	p[1] = (((long double)(alpha+beta+2.0L))*x + ((long double)(alpha-beta)))/2.0L;
	if(n==1) return p[1];
	
	for(unsigned int i=1; i<=(n-1); ++i) {
		v  = 2*i + alpha + beta;
		a1 = 2*(i+1)*(i + alpha + beta + 1)*v;
		a2 = (v + 1)*(alpha*alpha - beta*beta);
		a3 = v*(v + 1)*(v + 2);
		a4 = 2*(i+alpha)*(i+beta)*(v + 2);
		
		p[i+1] = static_cast<long double>( (((long double)(a2)) + ((long double)(a3))*x)*p[i] - ((long double)(a4))*p[i-1])/((long double)(a1));
    } // for
	return p[n];
}